

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O3

t_int * sigvcf_perform(t_int *w)

{
  float fVar1;
  float *pfVar2;
  t_int tVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  t_bigorsmall32 pun;
  float fVar14;
  float fVar15;
  float fVar16;
  t_bigorsmall32 pun_1;
  float fVar17;
  double dVar18;
  float fVar19;
  float fVar20;
  
  pfVar8 = cos_table;
  pfVar2 = (float *)w[5];
  tVar3 = w[6];
  fVar16 = *pfVar2;
  fVar17 = pfVar2[1];
  if (0 < (int)tVar3) {
    fVar12 = pfVar2[2];
    fVar1 = pfVar2[3];
    fVar13 = (float)(-(uint)(0.0 < fVar12) & (uint)(1.0 / fVar12));
    lVar4 = w[4];
    lVar5 = w[3];
    lVar6 = w[1];
    lVar7 = w[2];
    lVar9 = 0;
    do {
      fVar14 = *(float *)(lVar7 + lVar9 * 4) * fVar1;
      fVar20 = 0.0;
      if (0.0 <= fVar14) {
        fVar20 = fVar14;
      }
      fVar15 = (float)((uint)(1.0 - fVar20 * fVar13) & -(uint)(0.0 < fVar13));
      fVar14 = 0.0;
      if (0.0 <= fVar15) {
        fVar14 = fVar15;
      }
      dVar18 = (double)(fVar20 * 81.4874) + 1572864.0;
      uVar11 = (uint)((ulong)dVar18 >> 0x20);
      fVar20 = (float)((double)((ulong)dVar18 & 0xffffffff | 0x4138000000000000) + -1572864.0);
      uVar10 = (ulong)(uVar11 & 0x1ff);
      fVar19 = ((pfVar8[uVar10 + 1] - pfVar8[uVar10]) * fVar20 + pfVar8[uVar10]) * fVar14;
      uVar10 = (ulong)(uVar11 + 0x180 & 0x1ff);
      fVar20 = ((pfVar8[uVar10 + 1] - pfVar8[uVar10]) * fVar20 + pfVar8[uVar10]) * fVar14;
      fVar15 = fVar20 * fVar16;
      fVar16 = ((1.0 - fVar14) * (2.0 - 2.0 / (fVar12 + 2.0)) * *(float *)(lVar6 + lVar9 * 4) +
               fVar16 * fVar19) - fVar20 * fVar17;
      *(float *)(lVar5 + lVar9 * 4) = fVar16;
      fVar17 = fVar15 + fVar19 * fVar17;
      *(float *)(lVar4 + lVar9 * 4) = fVar17;
      lVar9 = lVar9 + 1;
    } while ((int)tVar3 != (int)lVar9);
  }
  fVar12 = 0.0;
  if ((((uint)fVar16 >> 0x1d ^ (uint)fVar16 >> 0x1e) & 1) != 0) {
    fVar12 = fVar16;
  }
  fVar16 = 0.0;
  if ((((uint)fVar17 >> 0x1d ^ (uint)fVar17 >> 0x1e) & 1) != 0) {
    fVar16 = fVar17;
  }
  *pfVar2 = fVar12;
  pfVar2[1] = fVar16;
  return w + 7;
}

Assistant:

static t_int *sigvcf_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out1 = (t_sample *)(w[3]);
    t_sample *out2 = (t_sample *)(w[4]);
    t_vcfctl *c = (t_vcfctl *)(w[5]);
    int n = (int)w[6];
    int i;
    t_float re = c->c_re, re2;
    t_float im = c->c_im;
    t_float q = c->c_q;
    t_float isr = c->c_isr;
    t_float qinv = (q > 0? 1.0f/q : 0);
    t_float ampcorrect = 2. - 2. / (q + 2.);
    t_float coefr, coefi;
    float *tab = cos_table, *addr, f1, f2, frac;
    double dphase;
    int normhipart, tabindex;
    union tabfudge tf;

    tf.tf_d = UNITBIT32;
    normhipart = tf.tf_i[HIOFFSET];

    for (i = 0; i < n; i++)
    {
        float cf, cfindx, r, oneminusr;
        cf = *in2++ * isr;
        if (cf < 0) cf = 0;
        cfindx = cf * (float)(COSTABSIZE/6.28318f);
        r = (qinv > 0 ? 1 - cf * qinv : 0);
        if (r < 0) r = 0;
        oneminusr = 1.0f - r;
        dphase = ((double)(cfindx)) + UNITBIT32;
        tf.tf_d = dphase;
        tabindex = tf.tf_i[HIOFFSET] & (COSTABSIZE-1);
        addr = tab + tabindex;
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
        f1 = addr[0];
        f2 = addr[1];
        coefr = r * (f1 + frac * (f2 - f1));

        addr = tab + ((tabindex - (COSTABSIZE/4)) & (COSTABSIZE-1));
        f1 = addr[0];
        f2 = addr[1];
        coefi = r * (f1 + frac * (f2 - f1));

        f1 = *in1++;
        re2 = re;
        *out1++ = re = ampcorrect * oneminusr * f1
            + coefr * re2 - coefi * im;
        *out2++ = im = coefi * re2 + coefr * im;
    }
    if (PD_BIGORSMALL(re))
        re = 0;
    if (PD_BIGORSMALL(im))
        im = 0;
    c->c_re = re;
    c->c_im = im;
    return (w+7);
}